

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O0

void bfgs_rec(double *H,int N,int iter,int m,double *jac,double *sk,double *yk,double *r)

{
  int iVar1;
  int iVar2;
  double *B;
  double *C;
  double *A;
  double *B_00;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  double *beta;
  double *qs;
  double *temp2;
  double *temp1;
  double *alpha;
  double *rho;
  double *temp;
  double *q;
  int bound;
  int k;
  int ptr;
  int i;
  double *sk_local;
  double *jac_local;
  int m_local;
  int iter_local;
  int N_local;
  double *H_local;
  
  B = (double *)malloc((long)N << 3);
  C = (double *)malloc(8);
  A = (double *)malloc((long)N << 3);
  B_00 = (double *)malloc((long)N << 3);
  __ptr = malloc((long)m << 3);
  __ptr_00 = malloc((long)m << 3);
  __ptr_01 = malloc((long)m << 3);
  __ptr_02 = malloc((long)m << 3);
  for (k = 0; k < N; k = k + 1) {
    B[k] = jac[k];
    A[k] = 0.0;
    B_00[k] = 0.0;
  }
  q._0_4_ = m;
  if (iter <= m) {
    q._0_4_ = iter;
  }
  for (k = 0; k < m; k = k + 1) {
    *(undefined8 *)((long)__ptr_00 + (long)k * 8) = 0;
    *(undefined8 *)((long)__ptr + (long)k * 8) = 0;
  }
  for (k = 0; iVar1 = (int)q, k < m; k = k + 1) {
    *(undefined8 *)((long)__ptr_02 + (long)k * 8) = 0;
    *(undefined8 *)((long)__ptr_01 + (long)k * 8) = 0;
  }
  while (k = iVar1 + -1, -1 < k) {
    iVar2 = k * N;
    for (q._4_4_ = 0; q._4_4_ < N; q._4_4_ = q._4_4_ + 1) {
      A[q._4_4_] = yk[iVar2 + q._4_4_];
      B_00[q._4_4_] = sk[iVar2 + q._4_4_];
    }
    mmult(A,B_00,C,1,N,1);
    *(double *)((long)__ptr_01 + (long)k * 8) = 1.0 / *C;
    mmult(B_00,B,(double *)((long)__ptr + (long)k * 8),1,N,1);
    *(double *)((long)__ptr + (long)k * 8) =
         *(double *)((long)__ptr_01 + (long)k * 8) * *(double *)((long)__ptr + (long)k * 8);
    for (q._4_4_ = 0; iVar1 = k, q._4_4_ < N; q._4_4_ = q._4_4_ + 1) {
      B[q._4_4_] = -*(double *)((long)__ptr + (long)k * 8) * yk[iVar2 + q._4_4_] + B[q._4_4_];
    }
  }
  mmult(H,B,r,N,N,1);
  for (k = 0; k < (int)q; k = k + 1) {
    for (q._4_4_ = 0; q._4_4_ < N; q._4_4_ = q._4_4_ + 1) {
      A[q._4_4_] = yk[k * N + q._4_4_];
    }
    mmult(A,r,(double *)((long)__ptr_00 + (long)k * 8),1,N,1);
    *(double *)((long)__ptr_00 + (long)k * 8) =
         *(double *)((long)__ptr_01 + (long)k * 8) * *(double *)((long)__ptr_00 + (long)k * 8);
    for (q._4_4_ = 0; q._4_4_ < N; q._4_4_ = q._4_4_ + 1) {
      r[q._4_4_] = sk[k * N + q._4_4_] *
                   (*(double *)((long)__ptr + (long)k * 8) -
                   *(double *)((long)__ptr_00 + (long)k * 8)) + r[q._4_4_];
    }
  }
  free(B);
  free(C);
  free(__ptr_01);
  free(__ptr);
  free(A);
  free(B_00);
  free(__ptr_02);
  free(__ptr_00);
  return;
}

Assistant:

void bfgs_rec(double *H,int N,int iter,int m,double *jac,double *sk,double *yk,double *r) {
	int i,ptr,k,bound;
	double *q,*temp,*rho,*alpha,*temp1,*temp2,*qs,*beta;


	q = (double*) malloc(sizeof(double) *N);
	temp = (double*) malloc(sizeof(double) *1);
	temp1 = (double*) malloc(sizeof(double) *N);
	temp2 = (double*) malloc(sizeof(double) *N);
	alpha = (double*) malloc(sizeof(double) * m);
	beta = (double*) malloc(sizeof(double) * m);
	rho = (double*) malloc(sizeof(double) * m);
	qs = (double*) malloc(sizeof(double) * m);

	k = 0; ptr = 0; i = 0; bound = 0;
	
	for(i = 0;i < N;++i) {
		q[i] = jac[i];
		temp1[i] = 0.0;
		temp2[i] = 0.0;
	}

	if (iter <= m) {
		bound = iter;
	} else {
		bound = m;
	}

	for (i = 0; i < m;++i) {
		alpha[i] = beta[i] = 0.0;
	}

	for (i = 0; i < m;++i) {
		rho[i] = qs[i] = 0.0;
	}

	//mmult(yk,sk,temp,1,N,1);

	for (i = bound - 1; i >= 0; --i) {
		ptr = i * N;
		for(k = 0; k < N;++k) {
			temp1[k] = yk[ptr+k];
			temp2[k] = sk[ptr+k];
		}
		mmult(temp1,temp2,temp,1,N,1);
		rho[i] = 1.0/temp[0];
		mmult(temp2,q,alpha+i,1,N,1);
		alpha[i] *= rho[i];
		for(k = 0; k < N; ++k) {
			q[k] = q[k] - alpha[i] * yk[ptr + k];
		}
	}
	mmult(H,q,r,N,N,1);
	for (i = 0; i < bound;++i) {
		ptr = i * N;
		for(k = 0; k < N;++k) {
			temp1[k] = yk[ptr+k];
			//temp2[k] = r[ptr+k];
		}
		mmult(temp1,r,beta+i,1,N,1);
		beta[i] *= rho[i];
		for (k = 0; k < N;++k) {
			r[k] += sk[ptr+k] * (alpha[i] - beta[i]);
		}
	}

	

	free(q);
	free(temp);
	free(rho);
	free(alpha);
	free(temp1);
	free(temp2);
	free(qs);
	free(beta);
}